

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.h
# Opt level: O3

void google::protobuf::internal::ExtensionSet::
     ForEachPrefetchImpl<absl::lts_20250127::container_internal::btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<int,google::protobuf::internal::ExtensionSet::Extension,std::less<int>,std::allocator<std::pair<int_const,google::protobuf::internal::ExtensionSet::Extension>>,256,false>>,std::pair<int_const,google::protobuf::internal::ExtensionSet::Extension>&,std::pair<int_const,google::protobuf::internal::ExtensionSet::Extension>*>,google::protobuf::internal::ExtensionSet::InternalMergeFromSmallToEmpty(google::protobuf::MessageLite_const*,google::protobuf::internal::ExtensionSet_const&)::__0,google::protobuf::internal::ExtensionSet::Prefetch>
               (btree_node<absl::lts_20250127::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>
                *param_1,int param_2,undefined8 param_3,undefined4 param_4)

{
  int iVar1;
  int *piVar2;
  bool bVar3;
  reference ppVar4;
  ExtensionSet *pEVar5;
  MessageLite *extendee;
  MessageLite *extendee_00;
  uint uVar6;
  const_iterator other;
  const_iterator other_00;
  const_iterator other_01;
  const_iterator other_02;
  const_iterator other_03;
  const_iterator other_04;
  ExtensionSet *in_stack_00000010;
  long *in_stack_00000018;
  undefined8 *in_stack_00000020;
  btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>,_std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_&,_std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_*>
  local_58;
  btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>,_std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_&,_std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_*>
  local_48;
  undefined8 *local_38;
  
  other.position_ = param_4;
  other.node_ = (btree_node<absl::lts_20250127::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>
                 *)param_3;
  other._12_4_ = 0;
  local_58.node_ = param_1;
  local_58.position_ = param_2;
  local_48.node_ = param_1;
  local_48.position_ = param_2;
  bVar3 = absl::lts_20250127::container_internal::
          btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>,_std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_&,_std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_*>
          ::Equals(&local_48,other);
  if (!bVar3) {
    uVar6 = 0;
    do {
      ppVar4 = absl::lts_20250127::container_internal::
               btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>,_std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_&,_std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_*>
               ::operator*(&local_48);
      Extension::PrefetchPtr(&ppVar4->second);
      absl::lts_20250127::container_internal::
      btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>,_std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_&,_std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_*>
      ::increment(&local_48);
      other_00.position_ = param_4;
      other_00.node_ =
           (btree_node<absl::lts_20250127::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>
            *)param_3;
      other_00._12_4_ = 0;
      bVar3 = absl::lts_20250127::container_internal::
              btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>,_std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_&,_std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_*>
              ::Equals(&local_48,other_00);
      if (bVar3) break;
      bVar3 = uVar6 < 0xf;
      uVar6 = uVar6 + 1;
    } while (bVar3);
  }
  other_01.position_ = param_4;
  other_01.node_ =
       (btree_node<absl::lts_20250127::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>
        *)param_3;
  other_01._12_4_ = 0;
  bVar3 = absl::lts_20250127::container_internal::
          btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>,_std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_&,_std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_*>
          ::Equals(&local_48,other_01);
  if (!bVar3) {
    local_38 = in_stack_00000020;
    do {
      ppVar4 = absl::lts_20250127::container_internal::
               btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>,_std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_&,_std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_*>
               ::operator*(&local_58);
      iVar1 = ppVar4->first;
      ppVar4 = absl::lts_20250127::container_internal::
               btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>,_std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_&,_std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_*>
               ::operator*(&local_58);
      if (((ppVar4->second).field_0xa & 2) == 0) {
        piVar2 = (int *)*in_stack_00000018;
        *piVar2 = iVar1;
        InternalExtensionMergeFromIntoUninitializedExtension
                  (in_stack_00000010,(Extension *)(piVar2 + 2),extendee,(int)local_38,
                   &ppVar4->second,(Arena *)*local_38);
        *in_stack_00000018 = *in_stack_00000018 + 0x20;
      }
      ppVar4 = absl::lts_20250127::container_internal::
               btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>,_std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_&,_std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_*>
               ::operator*(&local_48);
      Extension::PrefetchPtr(&ppVar4->second);
      absl::lts_20250127::container_internal::
      btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>,_std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_&,_std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_*>
      ::increment(&local_58);
      absl::lts_20250127::container_internal::
      btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>,_std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_&,_std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_*>
      ::increment(&local_48);
      other_02.position_ = param_4;
      other_02.node_ =
           (btree_node<absl::lts_20250127::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>
            *)param_3;
      other_02._12_4_ = 0;
      bVar3 = absl::lts_20250127::container_internal::
              btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>,_std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_&,_std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_*>
              ::Equals(&local_48,other_02);
    } while (!bVar3);
  }
  other_03.position_ = param_4;
  other_03.node_ =
       (btree_node<absl::lts_20250127::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>
        *)param_3;
  other_03._12_4_ = 0;
  bVar3 = absl::lts_20250127::container_internal::
          btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>,_std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_&,_std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_*>
          ::Equals(&local_58,other_03);
  if (!bVar3) {
    pEVar5 = in_stack_00000010;
    do {
      ppVar4 = absl::lts_20250127::container_internal::
               btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>,_std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_&,_std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_*>
               ::operator*(&local_58);
      iVar1 = ppVar4->first;
      ppVar4 = absl::lts_20250127::container_internal::
               btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>,_std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_&,_std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_*>
               ::operator*(&local_58);
      if (((ppVar4->second).field_0xa & 2) == 0) {
        piVar2 = (int *)*in_stack_00000018;
        *piVar2 = iVar1;
        InternalExtensionMergeFromIntoUninitializedExtension
                  (in_stack_00000010,(Extension *)(piVar2 + 2),extendee_00,(int)pEVar5,
                   &ppVar4->second,(Arena *)*in_stack_00000020);
        *in_stack_00000018 = *in_stack_00000018 + 0x20;
      }
      absl::lts_20250127::container_internal::
      btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>,_std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_&,_std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_*>
      ::increment(&local_58);
      other_04.position_ = param_4;
      other_04.node_ =
           (btree_node<absl::lts_20250127::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>
            *)param_3;
      other_04._12_4_ = 0;
      bVar3 = absl::lts_20250127::container_internal::
              btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>,_std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_&,_std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_*>
              ::Equals(&local_58,other_04);
    } while (!bVar3);
  }
  return;
}

Assistant:

static void ForEachPrefetchImpl(Iterator it, Iterator end,
                                  KeyValueFunctor func,
                                  PrefetchFunctor prefetch_func) {
    // Note: based on arena's ChunkList::Cleanup().
    // Prefetch distance 16 performs better than 8 in load tests.
    constexpr int kPrefetchDistance = 16;
    Iterator prefetch = it;
    // Prefetch the first kPrefetchDistance extensions.
    for (int i = 0; prefetch != end && i < kPrefetchDistance; ++prefetch, ++i) {
      prefetch_func(prefetch->second.PrefetchPtr());
    }
    // For the middle extensions, call func and then prefetch the extension
    // kPrefetchDistance after the current one.
    for (; prefetch != end; ++it, ++prefetch) {
      func(it->first, it->second);
      prefetch_func(prefetch->second.PrefetchPtr());
    }
    // Call func on the rest without prefetching.
    for (; it != end; ++it) func(it->first, it->second);
  }